

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O2

void __thiscall AlphaVectorWeighted::BackProjectWeights(AlphaVectorWeighted *this)

{
  undefined1 auVar1 [16];
  _func_int *p_Var2;
  size_t __n;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  PlanningUnitMADPDiscrete *this_00;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<double,_std::allocator<double>_> w;
  allocator_type local_59;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  value_type_conflict3 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  undefined8 extraout_XMM0_Qb;
  
  p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             (&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
  }
  __n = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  local_58 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&(this->super_AlphaVectorPOMDP).field_0x40;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(local_58);
  uVar6 = 0;
  while( true ) {
    p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
    lVar5 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
    if (lVar5 == 0) {
      lVar5 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
    }
    uVar3 = (**(code **)(**(long **)(lVar5 + 0x30) + 0x68))();
    if (uVar3 == uVar6) break;
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,__n,&local_50,&local_59);
    for (uVar7 = 0; uVar3 = (ulong)uVar7, __n != uVar3; uVar7 = uVar7 + 1) {
      for (sVar4 = 0; __n != sVar4; sVar4 = (size_t)((int)sVar4 + 1)) {
        p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
        lVar5 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
        if (lVar5 == 0) {
          lVar5 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
        }
        auVar8._0_8_ = (**(code **)(**(long **)(lVar5 + 0x30) + 0x108))
                                 (*(long **)(lVar5 + 0x30),uVar3,uVar6,sVar4);
        auVar8._8_8_ = extraout_XMM0_Qb;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(*(long *)&(this->super_AlphaVectorPOMDP).field_0x28 + sVar4 * 8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_48._M_impl.super__Vector_impl_data._M_start[uVar3];
        auVar1 = vfmadd213sd_fma(auVar9,auVar8,auVar1);
        local_48._M_impl.super__Vector_impl_data._M_start[uVar3] = auVar1._0_8_;
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(local_58,(value_type *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    uVar6 = uVar6 + 1;
  }
  (this->super_AlphaVectorPOMDP).field_0x20 = 1;
  return;
}

Assistant:

void AlphaVectorWeighted::BackProjectWeights()
{
    size_t nrS=GetPU()->GetNrStates();

    _m_weightsBackProjected.clear();
    for(Index ja=0;ja!=GetPU()->GetNrJointActions();++ja)
    {
        vector<double> w(nrS,0);
        for(Index s0=0;s0!=nrS;++s0)
            for(Index s1=0;s1!=nrS;++s1)
                w[s0]+=GetPU()->GetTransitionProbability(s0,ja,s1)*
                    _m_weights[s1];

        _m_weightsBackProjected.push_back(w);
    }

    _m_initialized=true;
}